

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_thread.hpp
# Opt level: O1

void __thiscall
so_5::disp::reuse::work_thread::details::activity_tracking_impl_t::serve_demands_block
          (activity_tracking_impl_t *this,demand_container_t *demands)

{
  demands_counter_t *pdVar1;
  duration_t *pdVar2;
  __atomic_flag_data_type _Var3;
  ulong uVar4;
  duration dVar5;
  int iVar6;
  _Elt_pointer peVar7;
  time_point activity_started_at;
  time_point local_30;
  
  local_30.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  while( true ) {
    LOCK();
    _Var3 = (this->m_stats_lock).m_flag.super___atomic_flag_base._M_i;
    (this->m_stats_lock).m_flag.super___atomic_flag_base._M_i = true;
    UNLOCK();
    if (_Var3 == false) break;
    sched_yield();
  }
  this->m_activity_started_at = &local_30;
  (this->m_activity_stats).m_count = (this->m_activity_stats).m_count + 1;
  (this->m_stats_lock).m_flag.super___atomic_flag_base._M_i = false;
  peVar7 = (demands->
           super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>).
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((demands->
      super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>).
      _M_impl.super__Deque_impl_data._M_finish._M_cur != peVar7) {
    do {
      (*peVar7->m_demand_handler)
                ((current_thread_id_t)
                 (this->
                 super_common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
                 ).m_thread_id._M_thread,peVar7);
      dVar5.__r = std::chrono::_V2::steady_clock::now();
      std::deque<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>::pop_front
                (demands);
      LOCK();
      pdVar1 = &(this->
                super_common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
                ).m_demands_count;
      (pdVar1->super___atomic_base<unsigned_long>)._M_i =
           (pdVar1->super___atomic_base<unsigned_long>)._M_i - 1;
      UNLOCK();
      while( true ) {
        LOCK();
        _Var3 = (this->m_stats_lock).m_flag.super___atomic_flag_base._M_i;
        (this->m_stats_lock).m_flag.super___atomic_flag_base._M_i = true;
        UNLOCK();
        if (_Var3 == false) break;
        sched_yield();
      }
      pdVar2 = &(this->m_activity_stats).m_total_time;
      pdVar2->__r = pdVar2->__r + (dVar5.__r - (long)local_30.__d.__r);
      uVar4 = (this->m_activity_stats).m_count;
      iVar6 = (int)uVar4;
      if (uVar4 == 0) {
        iVar6 = 1;
      }
      if (100 < uVar4) {
        iVar6 = 100;
      }
      (this->m_activity_stats).m_avg_time.__r =
           ((long)(iVar6 + -1) * (this->m_activity_stats).m_avg_time.__r +
           (dVar5.__r - (long)local_30.__d.__r)) / (long)iVar6;
      if ((demands->
          super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>).
          _M_impl.super__Deque_impl_data._M_finish._M_cur ==
          (demands->
          super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>).
          _M_impl.super__Deque_impl_data._M_start._M_cur) {
        this->m_activity_started_at = (time_point *)0x0;
      }
      else {
        (this->m_activity_stats).m_count = uVar4 + 1;
        local_30.__d.__r = (duration)(duration)dVar5.__r;
      }
      (this->m_stats_lock).m_flag.super___atomic_flag_base._M_i = false;
      peVar7 = (demands->
               super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>
               )._M_impl.super__Deque_impl_data._M_start._M_cur;
    } while ((demands->
             super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>)
             ._M_impl.super__Deque_impl_data._M_finish._M_cur != peVar7);
  }
  return;
}

Assistant:

void
	serve_demands_block(
		//! Bunch of demands to be processed.
		demand_container_t & demands )
	{
		auto activity_started_at = so_5::stats::clock_type_t::now();

		{
			std::lock_guard< activity_tracking_traits::lock_t > lock{ m_stats_lock };
			m_activity_started_at = &activity_started_at;
			m_activity_stats.m_count += 1;
		}

		while( !demands.empty() )
		{
			auto & demand = demands.front();

			demand.call_handler( m_thread_id );

			const auto activity_finished_at = so_5::stats::clock_type_t::now();

			demands.pop_front();
			--m_demands_count;

			{
				std::lock_guard< activity_tracking_traits::lock_t > lock{ m_stats_lock };
				so_5::stats::details::update_stats_from_duration(
						m_activity_stats,
						activity_finished_at - activity_started_at );

				if( demands.empty() )
					m_activity_started_at = nullptr;
				else
				{
					activity_started_at = activity_finished_at;
					m_activity_stats.m_count += 1;
				}
			}
		}
	}